

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void poly_genresult(ssh2_mac *mac,uchar *blk)

{
  BinarySink *pBVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  int i;
  ulong uVar8;
  long lVar9;
  uchar *data;
  bigval bStack_38;
  
  if (*(int *)&mac[-3].binarysink_ != 0) {
    poly1305_feed_chunk((poly1305 *)&mac[-8].binarysink_,(uchar *)&mac[-4].binarysink_,
                        *(int *)&mac[-3].binarysink_);
  }
  bigval_import_le(&bStack_38,&mac[-8].binarysink_,0x10);
  pBVar1 = mac[-5].binarysink_;
  uVar7 = (uint)mac[-4].vt & 3;
  uVar2 = ((ulong)mac[-4].vt >> 2) * 5;
  uVar8 = (long)&(mac[-5].vt)->new + uVar2;
  uVar2 = (ulong)CARRY8(uVar2,(ulong)mac[-5].vt);
  uVar6 = (long)&pBVar1->write + uVar2;
  uVar4 = (ulong)(uVar7 + CARRY8((ulong)pBVar1,uVar2) +
                  (uint)CARRY8(uVar6,(ulong)(0xfffffffffffffffa < uVar8)) >> 2) * 5;
  uVar3 = (ulong)CARRY8(uVar4,uVar8);
  mac[-5].vt = (ssh2_macalg *)(uVar4 + uVar8);
  mac[-5].binarysink_ = (BinarySink *)(uVar6 + uVar3);
  mac[-4].vt = (ssh2_macalg *)
               (ulong)(CARRY8(uVar6,uVar3) + uVar7 + (uint)CARRY8((ulong)pBVar1,uVar2) & 3);
  bigval_add(&bStack_38,&bStack_38,(bigval *)(mac + -5));
  bVar5 = 0;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    blk[lVar9] = (uchar)(*(ulong *)((long)bStack_38.w + (ulong)((uint)lVar9 & 0xfffffff8)) >>
                        (bVar5 & 0x38));
    bVar5 = bVar5 + 8;
  }
  return;
}

Assistant:

static void poly_genresult(ssh2_mac *mac, unsigned char *blk)
{
    struct ccp_context *ctx = container_of(mac, struct ccp_context, mac_if);
    poly1305_finalise(&ctx->mac, blk);
}